

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O2

ON_SubDSectorId ON_SubDSectorId::Create(ON_SubDVertex *vertex,ON_SubDFace *face)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  undefined8 uVar6;
  ON_SubDEdge *pOVar7;
  ON_SubDEdge *pOVar8;
  ON_SubDVertex *pOVar9;
  ON_SubDFace *pOVar10;
  short sVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ON_SubDSectorIterator *pOVar15;
  uint uVar16;
  ON_SubDSectorIterator *pOVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ON_SubDSectorId *pOVar21;
  byte bVar22;
  ON_SubDSectorId OVar23;
  ON_SubDSectorId local_e8;
  ON_SubDComponentPtrPair pair;
  ON_SubDSectorIterator sit0;
  ON_SubDSectorIterator sit1;
  
  bVar22 = 0;
  pOVar21 = &local_e8;
  local_e8.m_vertex_id = 0;
  local_e8.m_minimum_face_id = 0;
  local_e8.m_sector_face_count = 0;
  if (vertex == (ON_SubDVertex *)0x0 || face != (ON_SubDFace *)0x0) {
LAB_006172aa:
    if (vertex != (ON_SubDVertex *)0x0 && face != (ON_SubDFace *)0x0) {
      uVar13 = 0;
      uVar5 = 0;
      if (((((1 < (vertex->super_ON_SubDComponentBase).m_id + 1) &&
            (1 < (face->super_ON_SubDComponentBase).m_id + 1)) && (2 < face->m_edge_count)) &&
          ((uVar13 = uVar5, 1 < vertex->m_edge_count && (vertex->m_face_count != 0)))) &&
         (uVar5 = ON_SubDFace::VertexIndex(face,vertex), uVar5 < face->m_edge_count)) {
        uVar20 = (face->super_ON_SubDComponentBase).m_id;
        local_e8.m_minimum_face_id = uVar20;
        local_e8.m_vertex_id = (vertex->super_ON_SubDComponentBase).m_id;
        uVar1 = vertex->m_face_count;
        bVar4 = ON_SubDVertex::IsSmoothOrDart(vertex);
        if (bVar4) {
          if ((1 < uVar1) && (uVar1 == vertex->m_edge_count)) {
            bVar4 = ON_SubDVertex::IsDart(vertex);
            uVar5 = (uint)bVar4;
            sVar11 = (ushort)bVar4 + (ushort)bVar4;
LAB_00617392:
            uVar16 = 0;
            for (uVar14 = 0; vertex->m_edge_count != uVar14; uVar14 = uVar14 + 1) {
              uVar18 = vertex->m_edges[uVar14].m_ptr & 0xfffffffffffffff8;
              uVar6 = Invalid._0_8_;
              uVar13 = Invalid.m_sector_face_count;
              if (((uVar18 == 0) || (sVar2 = *(short *)(uVar18 + 100), sVar2 == 0)) ||
                 (uVar19 = *(ulong *)(uVar18 + 0x68) & 0xfffffffffffffff8, uVar19 == 0))
              goto LAB_00617302;
              uVar3 = *(uint *)(uVar19 + 8);
              if (uVar3 < uVar20) {
                uVar20 = uVar3;
              }
              if (*(char *)(uVar18 + 0x60) == '\x02') {
                uVar16 = uVar16 + 1;
                if ((uVar5 < uVar16) || (sVar2 != sVar11)) goto LAB_00617302;
                if (sVar11 != 1) goto LAB_006173fd;
              }
              else {
LAB_006173fd:
                if ((sVar2 != 2) ||
                   (uVar18 = *(ulong *)(uVar18 + 0x70) & 0xfffffffffffffff8, uVar18 == 0))
                goto LAB_00617302;
                uVar13 = *(uint *)(uVar18 + 8);
                if (uVar13 < uVar20) {
                  uVar20 = uVar13;
                }
              }
            }
            local_e8.m_minimum_face_id = uVar20;
            uVar13 = 0;
            if (uVar16 == uVar5) {
              uVar13 = (uint)uVar1;
              local_e8.m_sector_face_count = (uint)uVar1;
            }
          }
        }
        else {
          bVar4 = ON_SubDVertex::IsCreaseOrCorner(vertex);
          if (bVar4) {
            if ((uVar1 + 1 == (uint)vertex->m_edge_count) &&
               (uVar16 = ON_SubDVertex::CreasedEdgeCount(vertex,true,true,true,false), uVar16 == 2))
            {
              pair = ON_SubDVertex::BoundaryEdgePair(vertex);
            }
            else {
              pair.m_pair[1].m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
              pair.m_pair[0].m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
            }
            bVar4 = ON_SubDComponentPtrPair::BothAreNotNull(&pair);
            if (bVar4) {
              sit0.m_center_vertex = (ON_SubDVertex *)ON_SubDComponentPtrPair::First(&pair);
              pOVar7 = ON_SubDComponentPtr::Edge((ON_SubDComponentPtr *)&sit0);
              sit1.m_center_vertex = (ON_SubDVertex *)ON_SubDComponentPtrPair::Second(&pair);
              pOVar8 = ON_SubDComponentPtr::Edge((ON_SubDComponentPtr *)&sit1);
              if (((pOVar8 != (ON_SubDEdge *)0x0 && pOVar7 != (ON_SubDEdge *)0x0) &&
                  (pOVar7->m_face_count == 1)) && (pOVar8->m_face_count == 1)) {
                sVar11 = 1;
                uVar5 = 2;
                goto LAB_00617392;
              }
            }
            else {
              bVar4 = ON_SubDVertex::IsCrease(vertex);
              if ((bVar4) &&
                 (uVar6 = Invalid._0_8_, uVar13 = Invalid.m_sector_face_count,
                 uVar1 != vertex->m_edge_count)) goto LAB_00617302;
              sit0.m_current_fei[0] = 0;
              sit0.m_current_fei[1] = 0;
              sit0.m_initial_face_dir = 0;
              sit0.m_current_face_dir = 0;
              sit0.m_current_eptr[1].m_ptr = 0;
              sit0.m_initial_fvi = 0;
              sit0.m_current_fvi = 0;
              sit0.m_current_face = (ON_SubDFace *)0x0;
              sit0.m_current_eptr[0].m_ptr = 0;
              sit0.m_center_vertex = (ON_SubDVertex *)0x0;
              sit0.m_initial_face = (ON_SubDFace *)0x0;
              sit0.m_current_ring_index = 0;
              pOVar9 = ON_SubDSectorIterator::Initialize(&sit0,face,0,uVar5);
              uVar6 = Invalid._0_8_;
              uVar13 = Invalid.m_sector_face_count;
              if (pOVar9 != vertex) goto LAB_00617302;
              pOVar15 = &sit0;
              pOVar17 = &sit1;
              for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
                pOVar17->m_center_vertex = pOVar15->m_center_vertex;
                pOVar15 = (ON_SubDSectorIterator *)((long)pOVar15 + (ulong)bVar22 * -0x10 + 8);
                pOVar17 = (ON_SubDSectorIterator *)((long)pOVar17 + (ulong)bVar22 * -0x10 + 8);
              }
              uVar13 = 1;
              while ((pOVar10 = ON_SubDSectorIterator::NextFace(&sit0,AnyCrease),
                     pOVar10 != (ON_SubDFace *)0x0 && (uVar13 <= vertex->m_face_count))) {
                uVar13 = uVar13 + 1;
                uVar5 = (pOVar10->super_ON_SubDComponentBase).m_id;
                if (uVar5 < uVar20) {
                  uVar20 = uVar5;
                }
              }
              while ((pOVar10 = ON_SubDSectorIterator::PrevFace(&sit1,AnyCrease),
                     pOVar10 != (ON_SubDFace *)0x0 && (uVar13 <= vertex->m_face_count))) {
                uVar13 = uVar13 + 1;
                uVar5 = (pOVar10->super_ON_SubDComponentBase).m_id;
                if (uVar5 < uVar20) {
                  uVar20 = uVar5;
                }
              }
              local_e8.m_minimum_face_id = uVar20;
              local_e8.m_sector_face_count = uVar13;
            }
          }
        }
      }
      bVar4 = IsSet(&local_e8);
      if ((!bVar4) || (vertex->m_face_count < uVar13)) {
        pOVar21 = &Invalid;
        uVar13 = Invalid.m_sector_face_count;
      }
      uVar6._0_4_ = pOVar21->m_vertex_id;
      uVar6._4_4_ = pOVar21->m_minimum_face_id;
      goto LAB_00617302;
    }
  }
  else {
    bVar4 = ON_SubDVertex::IsSingleSectorVertex(vertex);
    if (bVar4) {
      face = ON_SubDVertex::Face(vertex,0);
      goto LAB_006172aa;
    }
  }
  uVar6._0_4_ = 0;
  uVar6._4_4_ = 0;
  uVar13 = 0xffffffff;
LAB_00617302:
  OVar23.m_sector_face_count = uVar13;
  OVar23.m_vertex_id = (uint)uVar6;
  OVar23.m_minimum_face_id = SUB84(uVar6,4);
  return OVar23;
}

Assistant:

const ON_SubDSectorId ON_SubDSectorId::Create(
  const ON_SubDVertex* vertex,
  const ON_SubDFace* face
)
{
  ON_SubDSectorId sid;

  if (nullptr == face && nullptr != vertex && vertex->IsSingleSectorVertex())
    face = vertex->Face(0);

  if (nullptr == vertex || nullptr == face)
  {
    // Creation of ON_SubDSectorId::Invalid in opennurbs_statics.cpp or 
    // just another invalid input.
    sid.m_vertex_id = 0;
    sid.m_minimum_face_id = 0;
    sid.m_sector_face_count = 0xFFFFFFFFU;
    return sid;
  }

  for (;;)
  {
    if (vertex->m_id <= 0 || vertex->m_id >= ON_UNSET_UINT_INDEX)
      break;
    if (face->m_id <= 0 || face->m_id >= ON_UNSET_UINT_INDEX)
      break;
    if (face->m_edge_count < 3)
      break;
    if (vertex->m_edge_count < 2)
      break;
    if (vertex->m_face_count < 1)
      break;
    const unsigned face_vi = face->VertexIndex(vertex);
    if (face_vi >= face->m_edge_count)
      break;

    sid.m_vertex_id = vertex->m_id;
    sid.m_minimum_face_id = face->m_id;
    const unsigned short n = vertex->m_face_count;
    unsigned short crease_face_count = 0;
    unsigned int expected_crease_count = 0;
    if (vertex->IsSmoothOrDart())
    {
      if (n < 2 || n != vertex->m_edge_count)
        break;
      const bool bIsDart = vertex->IsDart();
      crease_face_count = bIsDart ? 2 : 0;
      expected_crease_count = bIsDart ? 1 : 0;
    }
    else if ( vertex->IsCreaseOrCorner())
    {
      const ON_SubDComponentPtrPair pair 
        = (n + 1 == vertex->m_edge_count && 2==vertex->CreasedEdgeCount(true,true,true,false))
          ? vertex->BoundaryEdgePair()
          : ON_SubDComponentPtrPair::Null;
      if (pair.BothAreNotNull())
      {
        // we can avoid using a sector iterator
        const ON_SubDEdge* e[2] = { pair.First().Edge(),pair.Second().Edge() };
        if (nullptr == e[0] || nullptr == e[1])
          break;
        if (1 != e[0]->m_face_count || 1 != e[1]->m_face_count)
          break;
        crease_face_count = 1;
        expected_crease_count = 2;
      }
      else
      {
        if (vertex->IsCrease())
        {
          if (n != vertex->m_edge_count)
            return ON_SubDSectorId::Invalid;
        }

        // complicated case needs to use more time consuming sector iterator 
        ON_SubDSectorIterator sit0;
        if ( vertex != sit0.Initialize(face, 0, face_vi))
          return ON_SubDSectorId::Invalid;
        ON_SubDSectorIterator sit1(sit0);
        // advance sit0 until we hit a crease;
        sid.m_sector_face_count = 1;
        for (const ON_SubDFace* f = sit0.NextFace(ON_SubDSectorIterator::StopAt::AnyCrease); nullptr != f && sid.m_sector_face_count <= vertex->m_face_count; f = sit0.NextFace(ON_SubDSectorIterator::StopAt::AnyCrease))
        {
          ++sid.m_sector_face_count;
          if (f->m_id < sid.m_minimum_face_id)
            sid.m_minimum_face_id = f->m_id;
        }
        // advance sit1 until we hit a crease;
        for (const ON_SubDFace* f = sit1.PrevFace(ON_SubDSectorIterator::StopAt::AnyCrease); nullptr != f && sid.m_sector_face_count <= vertex->m_face_count; f = sit1.PrevFace(ON_SubDSectorIterator::StopAt::AnyCrease))
        {
          ++sid.m_sector_face_count;
          if (f->m_id < sid.m_minimum_face_id)
            sid.m_minimum_face_id = f->m_id;
        }
        break;
      }
    }
    else
    {
      break;
    }

    if (0 == sid.m_sector_face_count)
    {
      // we can avoid expensive sector iterator.
      unsigned int crease_count = 0;
      const ON_SubDFace* f;
      for (unsigned short vei = 0; vei < vertex->m_edge_count; ++vei)
      {
        const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(vertex->m_edges[vei].m_ptr);
        if (nullptr == e || 0 == e->m_face_count)
          return ON_SubDSectorId::Invalid;
        f = ON_SUBD_FACE_POINTER(e->m_face2[0].m_ptr);
        if (nullptr == f)
          return ON_SubDSectorId::Invalid;
        if (f->m_id < sid.m_minimum_face_id)
          sid.m_minimum_face_id = f->m_id;
        if (ON_SubDEdgeTag::Crease == e->m_edge_tag)
        {
          ++crease_count;
          if (crease_count > expected_crease_count)
            return ON_SubDSectorId::Invalid;
          if (crease_face_count != e->m_face_count)
            return ON_SubDSectorId::Invalid;
          if (1 == crease_face_count)
            continue;
        }
        if (2 != e->m_face_count)
          return ON_SubDSectorId::Invalid;
        f = ON_SUBD_FACE_POINTER(e->m_face2[1].m_ptr);
        if (nullptr == f)
          return ON_SubDSectorId::Invalid;
        if (f->m_id < sid.m_minimum_face_id)
          sid.m_minimum_face_id = f->m_id;
      }
      if (crease_count == expected_crease_count)
        sid.m_sector_face_count = n;
    }
    break;
  }

  return (sid.IsSet() && sid.m_sector_face_count <= vertex->m_face_count) ? sid : ON_SubDSectorId::Invalid;
}